

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O3

int get_prim_type(char *value)

{
  int iVar1;
  
  iVar1 = strcmp(value,"ALLEGRO_PRIM_POINT_LIST");
  if (iVar1 == 0) {
    iVar1 = 6;
  }
  else {
    iVar1 = strcmp(value,"ALLEGRO_PRIM_LINE_LIST");
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = strcmp(value,"ALLEGRO_PRIM_LINE_STRIP");
      if (iVar1 == 0) {
        iVar1 = 1;
      }
      else {
        iVar1 = strcmp(value,"ALLEGRO_PRIM_LINE_LOOP");
        if (iVar1 == 0) {
          iVar1 = 2;
        }
        else {
          iVar1 = strcmp(value,"ALLEGRO_PRIM_TRIANGLE_LIST");
          if (iVar1 == 0) {
            iVar1 = 3;
          }
          else {
            iVar1 = strcmp(value,"ALLEGRO_PRIM_TRIANGLE_STRIP");
            if (iVar1 == 0) {
              iVar1 = 4;
            }
            else {
              iVar1 = strcmp(value,"ALLEGRO_PRIM_TRIANGLE_FAN");
              if (iVar1 != 0) {
                iVar1 = atoi(value);
                return iVar1;
              }
              iVar1 = 5;
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int get_prim_type(char const *value)
{
   return streq(value, "ALLEGRO_PRIM_POINT_LIST") ? ALLEGRO_PRIM_POINT_LIST
      : streq(value, "ALLEGRO_PRIM_LINE_LIST") ? ALLEGRO_PRIM_LINE_LIST
      : streq(value, "ALLEGRO_PRIM_LINE_STRIP") ? ALLEGRO_PRIM_LINE_STRIP
      : streq(value, "ALLEGRO_PRIM_LINE_LOOP") ? ALLEGRO_PRIM_LINE_LOOP
      : streq(value, "ALLEGRO_PRIM_TRIANGLE_LIST") ? ALLEGRO_PRIM_TRIANGLE_LIST
      : streq(value, "ALLEGRO_PRIM_TRIANGLE_STRIP") ? ALLEGRO_PRIM_TRIANGLE_STRIP
      : streq(value, "ALLEGRO_PRIM_TRIANGLE_FAN") ? ALLEGRO_PRIM_TRIANGLE_FAN
      : atoi(value);
}